

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)1>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  bool bVar1;
  const_iterator copy;
  cell cStack_68;
  
  bVar1 = std::operator==(&it._M_current[2].val,"#t");
  copy._M_current = it._M_current + 1;
  if (bVar1) {
    copy._M_current = it._M_current;
  }
  cell::cell(&cStack_68,copy._M_current);
  SchemeFrame::setExpression(frame,&cStack_68);
  cell::~cell(&cStack_68);
  return false;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		const cell &conseq = *it; ++it;
		const cell &alt = *it; ++it;
		const cell &test = *it; ++it;
		const cell &if_result = (test.val == "#t") ? conseq : alt;
		frame.setExpression(cell(if_result));
		// Don't move exp_it
		return false;
	}